

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc *psVar1;
  byte bVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc *psVar5;
  int iVar6;
  
  psVar1 = s->buffer_start;
  iVar6 = 0;
  do {
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0016b74f:
      if (s->img_buffer_end <= s->img_buffer) {
        return iVar6;
      }
    }
    else {
      iVar4 = (*(s->io).eof)(s->io_user_data);
      if (iVar4 != 0) {
        if (s->read_from_callbacks == 0) {
          return iVar6;
        }
        goto LAB_0016b74f;
      }
    }
    bVar2 = *c;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      return iVar6;
    }
    psVar5 = s->img_buffer;
    if (psVar5 < s->img_buffer_end) {
      s->img_buffer = psVar5 + 1;
      sVar3 = *psVar5;
    }
    else if (s->read_from_callbacks == 0) {
      sVar3 = '\0';
    }
    else {
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar3 = '\0';
        psVar5 = s->buffer_start + 1;
      }
      else {
        sVar3 = *psVar1;
        psVar5 = psVar1 + iVar4;
      }
      s->img_buffer_end = psVar5;
      s->img_buffer = s->buffer_start + 1;
    }
    iVar6 = (bVar2 - 0x30) + iVar6 * 10;
    *c = sVar3;
  } while( true );
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
   }

   return value;
}